

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# route.c
# Opt level: O0

void init_route(route_t *record)

{
  route_t *record_local;
  
  strcpy(record->id,"");
  strcpy(record->agency_id,"");
  strcpy(record->short_name,"");
  strcpy(record->long_name,"");
  strcpy(record->desc,"");
  record->type = RT_NOT_SET;
  strcpy(record->url,"");
  strcpy(record->color,"");
  strcpy(record->text_color,"");
  record->sort_order = 0;
  return;
}

Assistant:

void init_route(route_t *record) {
    strcpy(record->id, "");
    strcpy(record->agency_id, "");
    strcpy(record->short_name, "");
    strcpy(record->long_name, "");
    strcpy(record->desc, "");
    record->type = RT_NOT_SET;
    strcpy(record->url, "");
    strcpy(record->color, "");
    strcpy(record->text_color, "");
    record->sort_order = 0;
}